

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall
QtPrivate::QWellArray::paintCell(QWellArray *this,QPainter *p,int row,int col,QRect *rect)

{
  bool bVar1;
  int iVar2;
  QPalette *pQVar3;
  QStyle *pQVar4;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  QWidget *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  QRect QVar5;
  int dfw;
  QPalette *g;
  int b;
  QStyleOptionFocusRect opt_1;
  QStyleOptionFrame opt;
  QWidget *in_stack_fffffffffffffed8;
  QWidget *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff08;
  int iVar6;
  QRect local_d0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_bc;
  QRect local_b8;
  undefined1 local_a8 [8];
  Int local_a0;
  undefined8 local_98;
  undefined8 local_90;
  QPalette aQStack_80 [2];
  undefined1 local_58 [8];
  Int local_50;
  undefined8 local_48;
  undefined8 local_40;
  QPalette QStack_30;
  int local_18;
  undefined4 local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 3;
  pQVar3 = QWidget::palette(in_stack_fffffffffffffee0);
  memset(local_58,0xaa,0x50);
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x731032);
  QStyleOption::initFrom
            ((QStyleOption *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),in_RDI);
  pQVar4 = QWidget::style(in_stack_fffffffffffffed8);
  iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,local_58,in_RDI);
  local_14 = 1;
  local_18 = iVar2;
  QVar5 = QRect::adjusted((QRect *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),(int)in_R8,
                          iVar6,in_stack_ffffffffffffff08);
  local_b8._0_8_ = QVar5._0_8_;
  local_48._0_4_ = local_b8.x1.m_i;
  local_48._4_4_ = local_b8.y1.m_i;
  local_b8._8_8_ = QVar5._8_8_;
  local_40._0_4_ = local_b8.x2.m_i;
  local_40._4_4_ = local_b8.y2.m_i;
  local_b8 = QVar5;
  QPalette::operator=(&QStack_30,(QPalette *)pQVar3);
  local_bc.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       ::operator|((enum_type)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                   (enum_type)in_stack_fffffffffffffee0);
  local_50 = (Int)local_bc.super_QFlagsStorage<QStyle::StateFlag>.i;
  pQVar4 = QWidget::style(in_stack_fffffffffffffed8);
  (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,0,local_58,in_RSI,in_RDI);
  iVar6 = iVar2 + iVar6;
  if (((in_EDX == *(int *)&in_RDI[1].super_QPaintDevice) &&
      (in_ECX == *(int *)&in_RDI[1].field_0x14)) &&
     (bVar1 = QWidget::hasFocus((QWidget *)CONCAT44(iVar2,in_stack_fffffffffffffef8)), bVar1)) {
    memset(local_a8,0xaa,0x50);
    QStyleOptionFocusRect::QStyleOptionFocusRect((QStyleOptionFocusRect *)0x73118f);
    QPalette::operator=(aQStack_80,(QPalette *)pQVar3);
    local_98 = *in_R8;
    local_90 = in_R8[1];
    local_c0.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         ::operator|((enum_type)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                     (enum_type)in_stack_fffffffffffffee0);
    local_a0 = (Int)local_c0.super_QFlagsStorage<QStyle::StateFlag>.i;
    pQVar4 = QWidget::style(in_stack_fffffffffffffed8);
    (**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,3,local_a8,in_RSI,in_RDI);
    QStyleOptionFocusRect::~QStyleOptionFocusRect((QStyleOptionFocusRect *)0x731216);
  }
  local_d0 = QRect::adjusted((QRect *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),(int)in_R8
                             ,iVar6,in_stack_ffffffffffffff08);
  (**(code **)(*(long *)in_RDI + 0x1b8))(in_RDI,in_RSI,in_EDX,in_ECX,&local_d0);
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x73128e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWellArray::paintCell(QPainter* p, int row, int col, const QRect &rect)
{
    int b = 3; //margin

    const QPalette & g = palette();
    QStyleOptionFrame opt;
    opt.initFrom(this);
    int dfw = style()->pixelMetric(QStyle::PM_DefaultFrameWidth, &opt, this);
    opt.lineWidth = dfw;
    opt.midLineWidth = 1;
    opt.rect = rect.adjusted(b, b, -b, -b);
    opt.palette = g;
    opt.state = QStyle::State_Enabled | QStyle::State_Sunken;
    style()->drawPrimitive(QStyle::PE_Frame, &opt, p, this);
    b += dfw;

    if ((row == curRow) && (col == curCol)) {
        if (hasFocus()) {
            QStyleOptionFocusRect opt;
            opt.palette = g;
            opt.rect = rect;
            opt.state = QStyle::State_None | QStyle::State_KeyboardFocusChange;
            style()->drawPrimitive(QStyle::PE_FrameFocusRect, &opt, p, this);
        }
    }
    paintCellContents(p, row, col, opt.rect.adjusted(dfw, dfw, -dfw, -dfw));
}